

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.cc
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  char *__s;
  double *pdVar2;
  long lVar3;
  size_type sVar4;
  pointer pdVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  ostream *poVar11;
  size_t sVar12;
  double *pdVar13;
  char *__s_00;
  int iVar14;
  double *pdVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  _Alloc_hider _Var17;
  string *input_stream;
  ulong uVar18;
  double dVar19;
  int fft_length;
  int frame_shift;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aperiodicity;
  vector<double,_std::allocator<double>_> f0;
  double upper_bound;
  double lower_bound;
  double sampling_rate;
  vector<double,_std::allocator<double>_> waveform;
  AperiodicityExtraction aperiodicity_extraction;
  vector<double,_std::allocator<double>_> output;
  ostringstream error_message;
  double tmp_3;
  undefined1 auStack_478 [8];
  int local_470;
  int local_46c;
  string local_468;
  Algorithms local_440;
  int local_43c;
  vector<double,_std::allocator<double>_> local_438;
  double local_418;
  double local_410;
  double local_408;
  double local_400;
  vector<double,_std::allocator<double>_> local_3f8;
  AperiodicityExtraction local_3e0;
  ulong local_3d0;
  vector<double,_std::allocator<double>_> local_3c8;
  string local_3b0;
  byte abStack_390 [80];
  ios_base local_340 [408];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_470 = 0x100;
  local_46c = 0x50;
  local_400 = 16.0;
  local_408 = 0.001;
  local_410 = 0.999;
  local_3d0 = 0;
  local_43c = 0;
  local_440 = kTandem;
LAB_00103881:
  do {
    paVar16 = &local_3b0.field_2;
    iVar10 = ya_getopt_long(argc,argv,"a:l:p:s:L:H:q:o:h",(option *)0x0,(int *)0x0);
    if (0x60 < iVar10) {
      switch(iVar10) {
      case 0x68:
        anon_unknown.dwarf_3e79::PrintUsage((ostream *)&std::cout);
        return 0;
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6d:
      case 0x6e:
      case 0x72:
        goto switchD_001038af_caseD_69;
      case 0x6c:
        std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
        bVar8 = sptk::ConvertStringToInteger(&local_3b0,&local_470);
        bVar7 = local_470 < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        if (!bVar8 || bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3b0,
                     "The argument for the -l option must be a positive integer",0x39);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
          sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
          goto LAB_00104356;
        }
        goto LAB_00103881;
      case 0x6f:
        std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
        bVar7 = sptk::ConvertStringToInteger(&local_3b0,(int *)&local_468);
        if (bVar7) {
          bVar7 = sptk::IsInRange((Algorithms)local_468._M_dataplus._M_p,0,3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar16) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
          if (bVar7) {
            local_3d0 = (ulong)local_468._M_dataplus._M_p & 0xffffffff;
            goto LAB_00103881;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3b0._M_dataplus._M_p != paVar16) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"The argument for the -o option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"in the range of ",0x10);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_3b0,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
        std::ostream::operator<<((ostream *)poVar11,3);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
        sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
        goto LAB_00104356;
      case 0x70:
        std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
        bVar8 = sptk::ConvertStringToInteger(&local_3b0,&local_46c);
        bVar7 = local_46c < 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        if (!bVar8 || bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3b0,
                     "The argument for the -p option must be a positive integer",0x39);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
          sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
          goto LAB_00104356;
        }
        goto LAB_00103881;
      case 0x71:
        std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
        bVar7 = sptk::ConvertStringToInteger(&local_3b0,(int *)&local_468);
        if (bVar7) {
          bVar7 = sptk::IsInRange((Algorithms)local_468._M_dataplus._M_p,0,2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar16) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
          if (bVar7) {
            local_43c = (Algorithms)local_468._M_dataplus._M_p;
            goto LAB_00103881;
          }
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3b0._M_dataplus._M_p != paVar16) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"The argument for the -q option must be an integer ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"in the range of ",0x10);
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_3b0,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
        std::ostream::operator<<((ostream *)poVar11,2);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
        sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
        goto LAB_00104356;
      case 0x73:
        std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
        bVar7 = sptk::ConvertStringToDouble(&local_3b0,&local_400);
        if (bVar7) {
          bVar7 = sptk::IsInRange(local_400,8.0,98.0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != paVar16) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
          if (bVar7) goto LAB_00103881;
        }
        else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_3b0._M_dataplus._M_p != paVar16) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"The argument for the -s option must be in a number ",0x33)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"in the interval [",0x11);
        poVar11 = std::ostream::_M_insert<double>(8.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
        poVar11 = std::ostream::_M_insert<double>(98.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
        sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
        goto LAB_00104356;
      default:
        if (iVar10 == 0x61) {
          std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
          bVar7 = sptk::ConvertStringToInteger(&local_3b0,(int *)&local_468);
          if (bVar7) {
            bVar7 = sptk::IsInRange((Algorithms)local_468._M_dataplus._M_p,0,1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != paVar16) {
              operator_delete(local_3b0._M_dataplus._M_p);
            }
            if (bVar7) {
              local_440 = (Algorithms)local_468._M_dataplus._M_p;
              goto LAB_00103881;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_3b0._M_dataplus._M_p != paVar16) {
            operator_delete(local_3b0._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3b0,"The argument for the -a option must be an integer ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3b0,"in the range of ",0x10);
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)&local_3b0,0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," to ",4);
          std::ostream::operator<<((ostream *)poVar11,1);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
          sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
          goto LAB_00104356;
        }
switchD_001038af_caseD_69:
        anon_unknown.dwarf_3e79::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
    }
    if (iVar10 != 0x48) {
      if (iVar10 != 0x4c) {
        if (iVar10 != -1) goto switchD_001038af_caseD_69;
        if (local_410 <= local_408) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_3b0,"Lower bound must be less than upper one",0x27);
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
          sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
          goto LAB_00104356;
        }
        if (argc - ya_optind == 1) {
          lVar3 = (long)argc + -1;
          __s_00 = (char *)0x0;
        }
        else {
          if (argc - ya_optind != 2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_3b0,"Just two input files, f0file and infile, are required"
                       ,0x35);
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
            sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
            goto LAB_00104356;
          }
          lVar3 = (long)argc + -2;
          __s_00 = argv[(long)argc + -1];
        }
        __s = argv[lVar3];
        bVar7 = sptk::SetBinaryMode();
        uVar6 = local_3d0;
        if (bVar7) {
          local_418 = local_400;
          local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (double *)0x0;
          local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (double *)0x0;
          local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (double *)0x0;
          std::ifstream::ifstream(&local_3b0);
          std::ifstream::open((char *)&local_3b0,(_Ios_Openmode)__s);
          if ((abStack_390[*(long *)(local_3b0._M_dataplus._M_p + -0x18)] & 5) == 0) {
            local_418 = local_418 * 1000.0;
            while (bVar7 = sptk::ReadStream<double>((double *)local_1a8,(istream *)&local_3b0),
                  pdVar5 = local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish, bVar7) {
              if (local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)&local_438,
                           (iterator)
                           local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(double *)local_1a8);
              }
              else {
                *local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish = (double)local_1a8[0]._M_dataplus._M_p;
                local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            pdVar13 = local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (local_43c == 2) {
              for (; pdVar13 != pdVar5; pdVar13 = pdVar13 + 1) {
                dVar1 = *pdVar13;
                dVar19 = 150.0;
                if ((dVar1 != -10000000000.0) || (NAN(dVar1))) {
                  dVar19 = exp(dVar1);
                }
                *pdVar13 = dVar19;
              }
            }
            else if (local_43c == 1) {
              for (; pdVar13 !=
                     local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                uVar18 = -(ulong)(*pdVar13 == 0.0);
                *pdVar13 = (double)(~uVar18 & (ulong)*pdVar13 | uVar18 & 0x4062c00000000000);
              }
            }
            else if (local_43c == 0) {
              for (; pdVar13 !=
                     local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                uVar18 = -(ulong)(*pdVar13 == 0.0);
                *pdVar13 = (double)(uVar18 & 0x4062c00000000000 |
                                   ~uVar18 & (ulong)(local_418 / *pdVar13));
              }
            }
            std::ifstream::~ifstream(&local_3b0);
            if (local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              iVar10 = 0;
              goto LAB_00104519;
            }
            local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (double *)0x0;
            local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (double *)0x0;
            local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (double *)0x0;
            input_stream = &local_3b0;
            std::ifstream::ifstream(input_stream);
            if ((__s_00 == (char *)0x0) ||
               (std::ifstream::open((char *)&local_3b0,(_Ios_Openmode)__s_00),
               (abStack_390[*(long *)(local_3b0._M_dataplus._M_p + -0x18)] & 5) == 0)) {
              cVar9 = std::__basic_file<char>::is_open();
              if (cVar9 == '\0') {
                input_stream = (string *)&std::cin;
              }
              while (bVar7 = sptk::ReadStream<double>((double *)local_1a8,(istream *)input_stream),
                    bVar7) {
                if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)&local_3f8,
                             (iterator)
                             local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish,(double *)local_1a8);
                }
                else {
                  *local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish = (double)local_1a8[0]._M_dataplus._M_p;
                  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              std::ifstream::~ifstream(&local_3b0);
              if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                iVar10 = 0;
              }
              else {
                sptk::AperiodicityExtraction::AperiodicityExtraction
                          (&local_3e0,local_470,local_46c,local_418,local_440);
                if ((local_3e0.aperiodicity_extraction_ == (AperiodicityExtractionInterface *)0x0)
                   || (iVar10 = (*(local_3e0.aperiodicity_extraction_)->
                                  _vptr_AperiodicityExtractionInterface[3])(), (char)iVar10 == '\0')
                   ) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_3b0,"Failed to initialize AperiodicityExtraction",
                             0x2b);
                  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
                  sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                    operator_delete(local_1a8[0]._M_dataplus._M_p);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
                  std::ios_base::~ios_base(local_340);
                  iVar10 = 1;
                }
                else {
                  local_468._M_dataplus._M_p = (pointer)0x0;
                  local_468._M_string_length = 0;
                  local_468.field_2._M_allocated_capacity = 0;
                  bVar7 = sptk::AperiodicityExtraction::Run
                                    (&local_3e0,&local_3f8,&local_438,
                                     (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      *)&local_468);
                  if (bVar7) {
                    iVar10 = local_470 / 2 + 1;
                    std::vector<double,_std::allocator<double>_>::vector
                              (&local_3c8,(long)iVar10,(allocator_type *)&local_3b0);
                    sVar4 = local_468._M_string_length;
                    if (local_468._M_dataplus._M_p == (pointer)local_468._M_string_length) {
LAB_00104962:
                      iVar10 = 0;
                    }
                    else {
                      _Var17._M_p = local_468._M_dataplus._M_p;
                      while( true ) {
                        pdVar2 = *(double **)((long)_Var17._M_p + 8);
                        pdVar15 = local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        for (pdVar13 = *(double **)_Var17._M_p; pdVar13 != pdVar2;
                            pdVar13 = pdVar13 + 1) {
                          dVar1 = *pdVar13;
                          if (*pdVar13 <= local_408) {
                            dVar1 = local_408;
                          }
                          if (local_410 <= dVar1) {
                            dVar1 = local_410;
                          }
                          *pdVar15 = dVar1;
                          pdVar15 = pdVar15 + 1;
                        }
                        iVar14 = (int)uVar6;
                        pdVar13 = local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                        if (iVar14 == 1) {
                          for (; pdVar13 !=
                                 local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                            *pdVar13 = 1.0 - *pdVar13;
                          }
                        }
                        else if (iVar14 == 2) {
                          for (; pdVar13 !=
                                 local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                            *pdVar13 = *pdVar13 / (1.0 - *pdVar13);
                          }
                        }
                        else if (iVar14 == 3) {
                          for (; pdVar13 !=
                                 local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish; pdVar13 = pdVar13 + 1) {
                            *pdVar13 = (1.0 - *pdVar13) / *pdVar13;
                          }
                        }
                        bVar7 = sptk::WriteStream<double>
                                          (0,iVar10,&local_3c8,(ostream *)&std::cout,(int *)0x0);
                        if (!bVar7) break;
                        _Var17._M_p = _Var17._M_p + 0x18;
                        if (_Var17._M_p == (pointer)sVar4) goto LAB_00104962;
                      }
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_3b0,"Failed to write aperiodicity",0x1c);
                      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
                      sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                        operator_delete(local_1a8[0]._M_dataplus._M_p);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
                      std::ios_base::~ios_base(local_340);
                      iVar10 = 1;
                    }
                    if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start != (double *)0x0) {
                      operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_3b0,"Failed to extract aperiodicity",0x1e);
                    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
                    sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
                      operator_delete(local_1a8[0]._M_dataplus._M_p);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
                    std::ios_base::~ios_base(local_340);
                    iVar10 = 1;
                  }
                  std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&local_468);
                }
                local_3e0._vptr_AperiodicityExtraction =
                     (_func_int **)&PTR__AperiodicityExtraction_0011ec18;
                if (local_3e0.aperiodicity_extraction_ != (AperiodicityExtractionInterface *)0x0) {
                  (*(local_3e0.aperiodicity_extraction_)->_vptr_AperiodicityExtractionInterface[1])
                            ();
                }
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Cannot open file ",0x11);
              sVar12 = strlen(__s_00);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s_00,sVar12)
              ;
              local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"ap","");
              sptk::PrintErrorMessage(&local_468,(ostringstream *)local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_468._M_dataplus._M_p != &local_468.field_2) {
                operator_delete(local_468._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              std::ifstream::~ifstream(&local_3b0);
              iVar10 = 1;
            }
            if (local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_3f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Cannot open file ",0x11);
            if (__s == (char *)0x0) {
              std::ios::clear((int)(auStack_478 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18))
                              + 0x2d0);
            }
            else {
              sVar12 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar12);
            }
            local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"ap","");
            sptk::PrintErrorMessage(&local_468,(ostringstream *)local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468._M_dataplus._M_p != &local_468.field_2) {
              operator_delete(local_468._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            std::ifstream::~ifstream(&local_3b0);
            iVar10 = 1;
          }
LAB_00104519:
          if (local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (double *)0x0) {
            operator_delete(local_438.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
            return iVar10;
          }
          return iVar10;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b0,"Cannot set translation mode",0x1b);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
        sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
        goto LAB_00104356;
      }
      std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
      bVar7 = sptk::ConvertStringToDouble(&local_3b0,&local_408);
      if (bVar7) {
        bVar7 = sptk::IsInRange(local_408,0.0,1.0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != paVar16) {
          operator_delete(local_3b0._M_dataplus._M_p);
        }
        if (bVar7) goto LAB_00103881;
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_3b0._M_dataplus._M_p != paVar16) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"The argument for the -L option must be in [0.0, 1.0]",0x34);
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
      sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
      goto LAB_00104356;
    }
    std::__cxx11::string::string((string *)&local_3b0,ya_optarg,(allocator *)local_1a8);
    bVar7 = sptk::ConvertStringToDouble(&local_3b0,&local_410);
    if (!bVar7) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar16) {
        operator_delete(local_3b0._M_dataplus._M_p);
      }
      goto LAB_00103ce4;
    }
    bVar7 = sptk::IsInRange(local_410,0.0,1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != paVar16) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
    if (!bVar7) {
LAB_00103ce4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_3b0,"The argument for the -H option must be in [0.0, 1.0]",0x34);
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"ap","");
      sptk::PrintErrorMessage(local_1a8,(ostringstream *)&local_3b0);
LAB_00104356:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_3b0);
      std::ios_base::~ios_base(local_340);
      return 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  sptk::AperiodicityExtraction::Algorithms algorithm(kDefaultAlgorithm);
  int fft_length(kDefaultFftLength);
  int frame_shift(kDefaultFrameShift);
  double sampling_rate(kDefaultSamplingRate);
  double lower_bound(kDefaultLowerBound);
  double upper_bound(kDefaultUpperBound);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "a:l:p:s:L:H:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'a': {
        const int min(0);
        const int max(
            static_cast<int>(
                sptk::AperiodicityExtraction::Algorithms::kNumAlgorithms) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        algorithm = static_cast<sptk::AperiodicityExtraction::Algorithms>(tmp);
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length) ||
            fft_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_shift) ||
            frame_shift <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        const double min(8.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            !sptk::IsInRange(sampling_rate, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be in a number "
                        << "in the interval [" << min << ", " << max << "]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_bound) ||
            !sptk::IsInRange(lower_bound, 0.0, 1.0)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -L option must be in [0.0, 1.0]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_bound) ||
            !sptk::IsInRange(upper_bound, 0.0, 1.0)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be in [0.0, 1.0]";
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ap", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (upper_bound <= lower_bound) {
    std::ostringstream error_message;
    error_message << "Lower bound must be less than upper one";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  const char* f0_file;
  const char* raw_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    f0_file = argv[argc - 2];
    raw_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    f0_file = argv[argc - 1];
    raw_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, f0file and infile, are required";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }
  const double sampling_rate_in_hz(1000.0 * sampling_rate);

  std::vector<double> f0;
  {
    std::ifstream ifs;
    ifs.open(f0_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << f0_file;
      sptk::PrintErrorMessage("ap", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      f0.push_back(tmp);
    }

    switch (input_format) {
      case kPitch: {
        std::transform(
            f0.begin(), f0.end(), f0.begin(), [sampling_rate_in_hz](double x) {
              return (0.0 == x) ? kDefaultF0 : sampling_rate_in_hz / x;
            });
        break;
      }
      case kF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(),
                       [](double x) { return (0.0 == x) ? kDefaultF0 : x; });
        break;
      }
      case kLogF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(), [](double x) {
          return (sptk::kLogZero == x) ? kDefaultF0 : std::exp(x);
        });
        break;
      }
      default: {
        break;
      }
    }
  }
  if (f0.empty()) return 0;

  std::vector<double> waveform;
  {
    std::ifstream ifs;
    if (NULL != raw_file) {
      ifs.open(raw_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << raw_file;
        sptk::PrintErrorMessage("ap", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      waveform.push_back(tmp);
    }
  }
  if (waveform.empty()) return 0;

  sptk::AperiodicityExtraction aperiodicity_extraction(
      fft_length, frame_shift, sampling_rate_in_hz, algorithm);
  if (!aperiodicity_extraction.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize AperiodicityExtraction";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  std::vector<std::vector<double> > aperiodicity;
  if (!aperiodicity_extraction.Run(waveform, f0, &aperiodicity)) {
    std::ostringstream error_message;
    error_message << "Failed to extract aperiodicity";
    sptk::PrintErrorMessage("ap", error_message);
    return 1;
  }

  const int output_length(fft_length / 2 + 1);
  std::vector<double> output(output_length);

  for (const std::vector<double>& tmp : aperiodicity) {
    std::transform(tmp.begin(), tmp.end(), output.begin(),
                   [lower_bound, upper_bound](double a) {
                     return std::min(upper_bound, std::max(lower_bound, a));
                   });

    switch (output_format) {
      case kAperiodicity: {
        // nothing to do
        break;
      }
      case kPeriodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return 1.0 - a; });
        break;
      }
      case kAperiodicityOverPeriodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return a / (1.0 - a); });
        break;
      }
      case kPeriodicityOverAperiodicity: {
        std::transform(output.begin(), output.end(), output.begin(),
                       [](double a) { return (1.0 - a) / a; });
        break;
      }
      default: {
        break;
      }
    }

    if (!sptk::WriteStream(0, output_length, output, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write aperiodicity";
      sptk::PrintErrorMessage("ap", error_message);
      return 1;
    }
  }

  return 0;
}